

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles2::Performance::InvalidShaderCompilerCase::iterate(InvalidShaderCompilerCase *this)

{
  Logs *pLVar1;
  TestLog *this_00;
  TestContext *this_01;
  InvalidShaderCompilerCase *pIVar2;
  bool bVar3;
  deUint32 cacheAvoidanceID;
  Shaders SVar4;
  deUint64 dVar5;
  deUint64 dVar6;
  deUint64 dVar7;
  deUint64 dVar8;
  long lVar9;
  MessageBuilder *this_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__n;
  code *pcVar10;
  code *__n_00;
  string *psVar11;
  int precision;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  void *__buf_14;
  ShaderValidity validity;
  int iVar12;
  int __fd;
  char *pcVar13;
  int iVar14;
  float fVar15;
  float fVar16;
  allocator<char> local_449;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  InvalidShaderCompilerCase *local_428;
  Shaders shaders_1;
  string local_3f0;
  _Vector_base<long,_std::allocator<long>_> local_3d0;
  vector<long,_std::allocator<long>_> rangeTimes;
  string local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  vector<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
  measurements;
  Shaders shaders;
  string plural;
  vector<long,_std::allocator<long>_> totalTimes;
  vector<long,_std::allocator<long>_> fragmentCompileTimes;
  vector<long,_std::allocator<long>_> vertexCompileTimes;
  vector<long,_std::allocator<long>_> sourceSetTimes;
  ProgramContext latestProgramContext;
  BuildInfo latestBuildInfo;
  BuildInfo buildInfo;
  
  validity = SHADER_VALIDITY_INVALID_CHAR;
  if (this->m_invalidityType != INVALIDITY_INVALID_CHAR) {
    validity = this->m_invalidityType == INVALIDITY_SEMANTIC_ERROR ^ SHADER_VALIDITY_LAST;
  }
  cacheAvoidanceID = getSpecializationID(this,0);
  latestBuildInfo._0_8_ = &latestBuildInfo.logs.vert._M_string_length;
  latestBuildInfo.logs.vert._M_dataplus._M_p = (pointer)0x0;
  latestBuildInfo.logs.vert._M_string_length =
       latestBuildInfo.logs.vert._M_string_length & 0xffffffffffffff00;
  latestBuildInfo.logs.vert.field_2._8_8_ = &latestBuildInfo.logs.frag._M_string_length;
  latestBuildInfo.logs.frag._M_dataplus._M_p = (pointer)0x0;
  latestBuildInfo.logs.frag._M_string_length =
       latestBuildInfo.logs.frag._M_string_length & 0xffffffffffffff00;
  singleVaryingVertexTemplate_abi_cxx11_();
  specializeShaderSource
            ((string *)&buildInfo,&latestProgramContext.vertShaderSource,cacheAvoidanceID,validity);
  std::__cxx11::string::operator=((string *)&latestBuildInfo,(string *)&buildInfo);
  std::__cxx11::string::~string((string *)&buildInfo);
  std::__cxx11::string::~string((string *)&latestProgramContext);
  singleVaryingFragmentTemplate_abi_cxx11_();
  specializeShaderSource
            ((string *)&buildInfo,&latestProgramContext.vertShaderSource,cacheAvoidanceID,validity);
  std::__cxx11::string::operator=
            ((string *)(latestBuildInfo.logs.vert.field_2._M_local_buf + 8),(string *)&buildInfo);
  std::__cxx11::string::~string((string *)&buildInfo);
  std::__cxx11::string::~string((string *)&latestProgramContext);
  SVar4 = createShaders(this);
  shaders = SVar4;
  setShaderSources(this,&shaders,(ProgramContext *)&latestBuildInfo);
  pLVar1 = &buildInfo.logs;
  buildInfo.logs.vert._M_dataplus._M_p = (pointer)&buildInfo.logs.vert.field_2;
  buildInfo.logs.vert._M_string_length = 0;
  buildInfo.logs.vert.field_2._M_local_buf[0] = '\0';
  buildInfo.logs.frag._M_dataplus._M_p = (pointer)&buildInfo.logs.frag.field_2;
  buildInfo.logs.frag._M_string_length = 0;
  buildInfo.logs.frag.field_2._M_local_buf[0] = '\0';
  bVar3 = compileShader(this,SVar4.vertShader);
  buildInfo.vertCompileSuccess = bVar3;
  bVar3 = compileShader(this,SVar4.fragShader);
  buildInfo.fragCompileSuccess = bVar3;
  if ((bVar3 | buildInfo.vertCompileSuccess) == 1) {
    getLogs((Logs *)&latestProgramContext,this,&shaders);
    Logs::operator=(pLVar1,(Logs *)&latestProgramContext);
    Logs::~Logs((Logs *)&latestProgramContext);
    logProgramData(this,&buildInfo,(ProgramContext *)&latestBuildInfo);
    cleanup(this,(EVP_PKEY_CTX *)&shaders);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Compilation of a shader erroneously succeeded");
    Logs::~Logs(pLVar1);
    ProgramContext::~ProgramContext((ProgramContext *)&latestBuildInfo);
  }
  else {
    cleanup(this,(EVP_PKEY_CTX *)&shaders);
    Logs::~Logs(pLVar1);
    ProgramContext::~ProgramContext((ProgramContext *)&latestBuildInfo);
    measurements.
    super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    measurements.
    super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    measurements.
    super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    latestProgramContext.vertShaderSource._M_dataplus._M_p =
         (pointer)&latestProgramContext.vertShaderSource.field_2;
    latestProgramContext.vertShaderSource._M_string_length = 0;
    latestProgramContext.vertShaderSource.field_2._M_local_buf[0] = '\0';
    latestProgramContext.fragShaderSource._M_dataplus._M_p =
         (pointer)&latestProgramContext.fragShaderSource.field_2;
    latestProgramContext.fragShaderSource._M_string_length = 0;
    __n = &latestBuildInfo.logs.vert.field_2;
    latestBuildInfo.logs.vert._M_string_length = 0;
    latestProgramContext.fragShaderSource.field_2._M_local_buf[0] = '\0';
    latestBuildInfo.logs.vert.field_2._M_local_buf[0] = '\0';
    latestBuildInfo.logs.frag._M_dataplus._M_p = (pointer)&latestBuildInfo.logs.frag.field_2;
    latestBuildInfo.logs.frag._M_string_length = 0;
    latestBuildInfo.logs.frag.field_2._M_local_buf[0] = '\0';
    local_428 = this;
    latestBuildInfo.logs.vert._M_dataplus._M_p = (pointer)__n;
    while( true ) {
      pIVar2 = local_428;
      bVar3 = goodEnoughMeasurements(local_428,&measurements);
      if (bVar3) break;
      (*(pIVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                ((ProgramContext *)&shaders,pIVar2,
                 ((long)measurements.
                        super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)measurements.
                       super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18 & 0xffffffff);
      SVar4 = createShaders(pIVar2);
      buildInfo.logs.vert._M_dataplus._M_p = (pointer)&buildInfo.logs.vert.field_2;
      buildInfo.logs.vert._M_string_length = 0;
      __n = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0;
      buildInfo.logs.vert.field_2._M_local_buf[0] = '\0';
      buildInfo.logs.frag._M_dataplus._M_p = (pointer)&buildInfo.logs.frag.field_2;
      buildInfo.logs.frag._M_string_length = 0;
      buildInfo.logs.frag.field_2._M_local_buf[0] = '\0';
      shaders_1 = SVar4;
      tcu::warmupCPU();
      dVar5 = deGetMicroseconds();
      setShaderSources(local_428,&shaders_1,(ProgramContext *)&shaders);
      dVar6 = deGetMicroseconds();
      bVar3 = compileShader(local_428,SVar4.vertShader);
      buildInfo.vertCompileSuccess = bVar3;
      dVar7 = deGetMicroseconds();
      bVar3 = compileShader(local_428,SVar4.fragShader);
      buildInfo.fragCompileSuccess = bVar3;
      dVar8 = deGetMicroseconds();
      getLogs((Logs *)&plural,local_428,&shaders_1);
      Logs::operator=(&buildInfo.logs,(Logs *)&plural);
      Logs::~Logs((Logs *)&plural);
      pIVar2 = local_428;
      if ((buildInfo.vertCompileSuccess != false) || (buildInfo.fragCompileSuccess == true)) {
        logProgramData(local_428,&buildInfo,(ProgramContext *)&shaders);
        cleanup(pIVar2,(EVP_PKEY_CTX *)&shaders_1);
        tcu::TestContext::setTestResult
                  ((pIVar2->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Compilation of a shader erroneously succeeded");
        Logs::~Logs(&buildInfo.logs);
        ProgramContext::~ProgramContext((ProgramContext *)&shaders);
        goto LAB_00f5e6d8;
      }
      cleanup(local_428,(EVP_PKEY_CTX *)&shaders_1);
      plural.field_2._M_allocated_capacity = dVar8 - dVar7;
      plural._M_string_length = dVar7 - dVar6;
      plural._M_dataplus._M_p = (pointer)(dVar6 - dVar5);
      std::
      vector<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
      ::emplace_back<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>
                (&measurements,(Measurement *)&plural);
      BuildInfo::operator=(&latestBuildInfo,&buildInfo);
      ProgramContext::operator=(&latestProgramContext,(ProgramContext *)&shaders);
      tcu::TestContext::touchWatchdog
                ((local_428->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      Logs::~Logs(&buildInfo.logs);
      ProgramContext::~ProgramContext((ProgramContext *)&shaders);
    }
    this_00 = ((pIVar2->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    sourceSetTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    sourceSetTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    sourceSetTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    vertexCompileTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vertexCompileTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vertexCompileTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    fragmentCompileTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    fragmentCompileTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    fragmentCompileTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    totalTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    totalTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    totalTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&shaders,"IterationMeasurements",(allocator<char> *)&shaders_1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&plural,"Iteration measurements of compilation times",
               (allocator<char> *)&local_448);
    tcu::LogSection::LogSection((LogSection *)&buildInfo,(string *)&shaders,&plural);
    __fd = (int)this_00;
    tcu::LogSection::write((LogSection *)&buildInfo,__fd,__buf,(size_t)__n);
    tcu::LogSection::~LogSection((LogSection *)&buildInfo);
    std::__cxx11::string::~string((string *)&plural);
    std::__cxx11::string::~string((string *)&shaders);
    local_3f0._M_dataplus._M_p._0_4_ = 0;
    while( true ) {
      if ((int)(((long)measurements.
                       super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)measurements.
                      super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) <=
          (int)local_3f0._M_dataplus._M_p) break;
      std::vector<long,_std::allocator<long>_>::push_back
                (&sourceSetTimes,
                 &measurements.
                  super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                  ._M_impl.super__Vector_impl_data._M_start[(int)local_3f0._M_dataplus._M_p].
                  sourceSetTime);
      std::vector<long,_std::allocator<long>_>::push_back
                (&vertexCompileTimes,
                 &measurements.
                  super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                  ._M_impl.super__Vector_impl_data._M_start[(int)local_3f0._M_dataplus._M_p].
                  vertexCompileTime);
      std::vector<long,_std::allocator<long>_>::push_back
                (&fragmentCompileTimes,
                 &measurements.
                  super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                  ._M_impl.super__Vector_impl_data._M_start[(int)local_3f0._M_dataplus._M_p].
                  fragmentCompileTime);
      lVar9 = (long)(int)local_3f0._M_dataplus._M_p;
      buildInfo._0_8_ =
           measurements.
           super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar9].vertexCompileTime +
           measurements.
           super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar9].sourceSetTime +
           measurements.
           super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar9].fragmentCompileTime;
      std::vector<long,_std::allocator<long>_>::emplace_back<long>(&totalTimes,(long *)&buildInfo);
      de::toString<int>((string *)&shaders_1,(int *)&local_3f0);
      std::operator+(&plural,"Measurement",(string *)&shaders_1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaders,
                     &plural,"Time");
      de::toString<int>(&local_398,(int *)&local_3f0);
      std::operator+(&local_378,"Measurement ",&local_398);
      std::operator+(&local_448,&local_378," time");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&rangeTimes,"ms",(allocator<char> *)&local_3d0);
      lVar9 = (long)(int)local_3f0._M_dataplus._M_p;
      psVar11 = (string *)&rangeTimes;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&buildInfo,(string *)&shaders,&local_448,(string *)&rangeTimes,
                 QP_KEY_TAG_TIME,
                 (float)(measurements.
                         super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar9].vertexCompileTime +
                         measurements.
                         super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar9].sourceSetTime +
                        measurements.
                        super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar9].fragmentCompileTime) /
                 1000.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)&buildInfo,__fd,__buf_00,(size_t)psVar11);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&buildInfo);
      std::__cxx11::string::~string((string *)&rangeTimes);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&shaders);
      std::__cxx11::string::~string((string *)&plural);
      std::__cxx11::string::~string((string *)&shaders_1);
      local_3f0._M_dataplus._M_p._0_4_ = (int)local_3f0._M_dataplus._M_p + 1;
    }
    iVar12 = 2;
    while( true ) {
      if (iVar12 == 0) break;
      pcVar13 = "LowestHalf";
      if (iVar12 == 2) {
        pcVar13 = glcts::fixed_sample_locations_values + 1;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&shaders,pcVar13,(allocator<char> *)&buildInfo);
      if (iVar12 == 2) {
        std::vector<long,_std::allocator<long>_>::vector(&rangeTimes,&totalTimes);
      }
      else {
        vectorLowestPercentage<long>(&rangeTimes,&totalTimes,0.5);
      }
      pLVar1 = &buildInfo.logs;
      buildInfo._0_8_ = this_00;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pLVar1);
      std::operator<<((ostream *)pLVar1,"\nStatistics computed from ");
      pcVar13 = "only the lowest 50%";
      if (iVar12 == 2) {
        pcVar13 = "all";
      }
      std::operator<<((ostream *)pLVar1,pcVar13);
      std::operator<<((ostream *)&buildInfo.logs," of the above measurements:");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&buildInfo,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buildInfo.logs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaders_1
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaders,
                     "TotalTime");
      std::operator+(&plural,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &shaders_1,"Median");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_378," of total time",(allocator<char> *)&local_3f0);
      std::operator+(&local_448,"Median",&local_378);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_398,"ms",(allocator<char> *)&local_3d0);
      fVar15 = vectorFloatMedian<long>(&rangeTimes);
      psVar11 = &local_398;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&buildInfo,&plural,&local_448,&local_398,QP_KEY_TAG_TIME,
                 fVar15 / 1000.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)&buildInfo,__fd,__buf_01,(size_t)psVar11);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&buildInfo);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&plural);
      std::__cxx11::string::~string((string *)&shaders_1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaders_1
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaders,
                     "TotalTime");
      std::operator+(&plural,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &shaders_1,"Average");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_378," of total time",(allocator<char> *)&local_3f0);
      std::operator+(&local_448,"Average",&local_378);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_398,"ms",(allocator<char> *)&local_3d0);
      fVar15 = vectorFloatAverage<long>(&rangeTimes);
      psVar11 = &local_398;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&buildInfo,&plural,&local_448,&local_398,QP_KEY_TAG_TIME,
                 fVar15 / 1000.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)&buildInfo,__fd,__buf_02,(size_t)psVar11);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&buildInfo);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&plural);
      std::__cxx11::string::~string((string *)&shaders_1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaders_1
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaders,
                     "TotalTime");
      std::operator+(&plural,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &shaders_1,"Minimum");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_378," of total time",(allocator<char> *)&local_3f0);
      std::operator+(&local_448,"Minimum",&local_378);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_398,"ms",(allocator<char> *)&local_3d0);
      fVar15 = vectorFloatMinimum<long>(&rangeTimes);
      psVar11 = &local_398;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&buildInfo,&plural,&local_448,&local_398,QP_KEY_TAG_TIME,
                 fVar15 / 1000.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)&buildInfo,__fd,__buf_03,(size_t)psVar11);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&buildInfo);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&plural);
      std::__cxx11::string::~string((string *)&shaders_1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaders_1
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaders,
                     "TotalTime");
      std::operator+(&plural,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &shaders_1,"Maximum");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_378," of total time",(allocator<char> *)&local_3f0);
      std::operator+(&local_448,"Maximum",&local_378);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_398,"ms",(allocator<char> *)&local_3d0);
      fVar15 = vectorFloatMaximum<long>(&rangeTimes);
      psVar11 = &local_398;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&buildInfo,&plural,&local_448,&local_398,QP_KEY_TAG_TIME,
                 fVar15 / 1000.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)&buildInfo,__fd,__buf_04,(size_t)psVar11);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&buildInfo);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&plural);
      std::__cxx11::string::~string((string *)&shaders_1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaders_1
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaders,
                     "TotalTime");
      std::operator+(&plural,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &shaders_1,"MedianAbsoluteDeviation");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_378," of total time",(allocator<char> *)&local_3f0);
      std::operator+(&local_448,"Median absolute deviation",&local_378);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_398,"ms",(allocator<char> *)&local_3d0);
      fVar15 = vectorFloatMedianAbsoluteDeviation<long>(&rangeTimes);
      psVar11 = &local_398;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&buildInfo,&plural,&local_448,&local_398,QP_KEY_TAG_TIME,
                 fVar15 / 1000.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)&buildInfo,__fd,__buf_05,(size_t)psVar11);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&buildInfo);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&plural);
      std::__cxx11::string::~string((string *)&shaders_1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaders_1
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaders,
                     "TotalTime");
      std::operator+(&plural,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &shaders_1,"RelativeMedianAbsoluteDeviation");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_378," of total time",(allocator<char> *)&local_3f0);
      std::operator+(&local_448,"Relative median absolute deviation",&local_378);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_398,glcts::fixed_sample_locations_values + 1,
                 (allocator<char> *)&local_3d0);
      fVar15 = vectorFloatRelativeMedianAbsoluteDeviation<long>(&rangeTimes);
      psVar11 = &local_398;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&buildInfo,&plural,&local_448,&local_398,QP_KEY_TAG_NONE,fVar15
                );
      tcu::LogNumber<float>::write((LogNumber<float> *)&buildInfo,__fd,__buf_06,(size_t)psVar11);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&buildInfo);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&plural);
      std::__cxx11::string::~string((string *)&shaders_1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaders_1
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaders,
                     "TotalTime");
      std::operator+(&plural,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &shaders_1,"StandardDeviation");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_378," of total time",(allocator<char> *)&local_3f0);
      std::operator+(&local_448,"Standard deviation",&local_378);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_398,"ms",(allocator<char> *)&local_3d0);
      fVar15 = vectorFloatStandardDeviation<long>(&rangeTimes);
      psVar11 = &local_398;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&buildInfo,&plural,&local_448,&local_398,QP_KEY_TAG_TIME,
                 fVar15 / 1000.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)&buildInfo,__fd,__buf_07,(size_t)psVar11);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&buildInfo);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&plural);
      std::__cxx11::string::~string((string *)&shaders_1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaders_1
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaders,
                     "TotalTime");
      std::operator+(&plural,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &shaders_1,"RelativeStandardDeviation");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_378," of total time",(allocator<char> *)&local_3f0);
      std::operator+(&local_448,"Relative standard deviation",&local_378);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_398,glcts::fixed_sample_locations_values + 1,
                 (allocator<char> *)&local_3d0);
      fVar15 = vectorFloatRelativeStandardDeviation<long>(&rangeTimes);
      psVar11 = &local_398;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&buildInfo,&plural,&local_448,&local_398,QP_KEY_TAG_NONE,fVar15
                );
      tcu::LogNumber<float>::write((LogNumber<float> *)&buildInfo,__fd,__buf_08,(size_t)psVar11);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&buildInfo);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&plural);
      std::__cxx11::string::~string((string *)&shaders_1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaders_1
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaders,
                     "TotalTime");
      std::operator+(&plural,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &shaders_1,"MaxMinusMin");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_378," of total time",(allocator<char> *)&local_3f0);
      std::operator+(&local_448,"Max-min",&local_378);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_398,"ms",(allocator<char> *)&local_3d0);
      fVar15 = vectorFloatMaximumMinusMinimum<long>(&rangeTimes);
      psVar11 = &local_398;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&buildInfo,&plural,&local_448,&local_398,QP_KEY_TAG_TIME,
                 fVar15 / 1000.0);
      tcu::LogNumber<float>::write((LogNumber<float> *)&buildInfo,__fd,__buf_09,(size_t)psVar11);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&buildInfo);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&plural);
      std::__cxx11::string::~string((string *)&shaders_1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaders_1
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaders,
                     "TotalTime");
      std::operator+(&plural,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &shaders_1,"RelativeMaxMinusMin");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_378," of total time",(allocator<char> *)&local_3f0);
      std::operator+(&local_448,"Relative max-min",&local_378);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_398,glcts::fixed_sample_locations_values + 1,
                 (allocator<char> *)&local_3d0);
      fVar15 = vectorFloatRelativeMaximumMinusMinimum<long>(&rangeTimes);
      psVar11 = &local_398;
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)&buildInfo,&plural,&local_448,&local_398,QP_KEY_TAG_NONE,fVar15
                );
      tcu::LogNumber<float>::write((LogNumber<float> *)&buildInfo,__fd,__buf_10,(size_t)psVar11);
      tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&buildInfo);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&plural);
      std::__cxx11::string::~string((string *)&shaders_1);
      if (iVar12 != 2) {
        fVar15 = vectorFloatRelativeMedianAbsoluteDeviation<long>(&rangeTimes);
        if (0.05 < fVar15) {
          buildInfo._0_8_ = this_00;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&buildInfo.logs);
          std::operator<<((ostream *)&buildInfo.logs,
                          "\nWARNING: couldn\'t achieve relative median absolute deviation under threshold value "
                         );
          this_02 = tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)&buildInfo,
                               (float *)&RELATIVE_MEDIAN_ABSOLUTE_DEVIATION_THRESHOLD);
          tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buildInfo.logs);
        }
      }
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                (&rangeTimes.super__Vector_base<long,_std::allocator<long>_>);
      std::__cxx11::string::~string((string *)&shaders);
      iVar12 = iVar12 + -1;
    }
    tcu::TestLog::endSection(this_00);
    iVar12 = 0;
    while( true ) {
      pIVar2 = local_428;
      if (iVar12 == 2) break;
      pcVar13 = "Average";
      if (iVar12 == 0) {
        pcVar13 = "Median";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&shaders,pcVar13,(allocator<char> *)&buildInfo);
      std::operator+(&plural,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &shaders,"s");
      pcVar10 = vectorFloatAverage<long>;
      if (iVar12 == 0) {
        pcVar10 = vectorFloatMedian<long>;
      }
      __n_00 = pcVar10;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaders_1
                     ,&plural,"PerPhase");
      std::operator+(&local_448,&plural," per phase");
      tcu::LogSection::LogSection((LogSection *)&buildInfo,(string *)&shaders_1,&local_448);
      tcu::LogSection::write((LogSection *)&buildInfo,__fd,__buf_11,(size_t)__n_00);
      tcu::LogSection::~LogSection((LogSection *)&buildInfo);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::~string((string *)&shaders_1);
      iVar14 = 2;
      while( true ) {
        if (iVar14 == 0) break;
        pcVar13 = "LowestHalf";
        if (iVar14 == 2) {
          pcVar13 = glcts::fixed_sample_locations_values + 1;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&shaders_1,pcVar13,(allocator<char> *)&buildInfo);
        pLVar1 = &buildInfo.logs;
        buildInfo._0_8_ = this_00;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)pLVar1);
        pcVar13 = "\nFor only the lowest 50% of the measurements:";
        if (iVar14 == 2) {
          pcVar13 = "For all measurements:";
        }
        std::operator<<((ostream *)pLVar1,pcVar13);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&buildInfo,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)pLVar1);
        std::operator+(&local_378,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &shaders_1,"ShaderSourceSetTime");
        std::operator+(&local_448,&local_378,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaders
                      );
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &rangeTimes,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaders
                       ," of ");
        std::operator+(&local_398,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &rangeTimes,"shader source set time");
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"ms",&local_449);
        fVar15 = *(float *)(&DAT_018368e4 + (ulong)(iVar14 == 2) * 4);
        vectorLowestPercentage<long>
                  ((vector<long,_std::allocator<long>_> *)&local_3d0,&sourceSetTimes,fVar15);
        fVar16 = (float)(*pcVar10)(&local_3d0);
        psVar11 = &local_3f0;
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)&buildInfo,&local_448,&local_398,psVar11,QP_KEY_TAG_TIME,
                   fVar16 / 1000.0);
        tcu::LogNumber<float>::write((LogNumber<float> *)&buildInfo,__fd,__buf_12,(size_t)psVar11);
        tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&buildInfo);
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_3d0);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&rangeTimes);
        std::__cxx11::string::~string((string *)&local_448);
        std::__cxx11::string::~string((string *)&local_378);
        std::operator+(&local_378,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &shaders_1,"VertexShaderCompileTime");
        std::operator+(&local_448,&local_378,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaders
                      );
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &rangeTimes,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaders
                       ," of ");
        std::operator+(&local_398,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &rangeTimes,"vertex shader compile time");
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"ms",&local_449);
        vectorLowestPercentage<long>
                  ((vector<long,_std::allocator<long>_> *)&local_3d0,&vertexCompileTimes,fVar15);
        fVar16 = (float)(*pcVar10)(&local_3d0);
        psVar11 = &local_3f0;
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)&buildInfo,&local_448,&local_398,psVar11,QP_KEY_TAG_TIME,
                   fVar16 / 1000.0);
        tcu::LogNumber<float>::write((LogNumber<float> *)&buildInfo,__fd,__buf_13,(size_t)psVar11);
        tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&buildInfo);
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_3d0);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&rangeTimes);
        std::__cxx11::string::~string((string *)&local_448);
        std::__cxx11::string::~string((string *)&local_378);
        std::operator+(&local_378,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &shaders_1,"FragmentShaderCompileTime");
        std::operator+(&local_448,&local_378,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaders
                      );
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &rangeTimes,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shaders
                       ," of ");
        std::operator+(&local_398,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &rangeTimes,"fragment shader compile time");
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"ms",&local_449);
        vectorLowestPercentage<long>
                  ((vector<long,_std::allocator<long>_> *)&local_3d0,&fragmentCompileTimes,fVar15);
        fVar15 = (float)(*pcVar10)(&local_3d0);
        psVar11 = &local_3f0;
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)&buildInfo,&local_448,&local_398,psVar11,QP_KEY_TAG_TIME,
                   fVar15 / 1000.0);
        tcu::LogNumber<float>::write((LogNumber<float> *)&buildInfo,__fd,__buf_14,(size_t)psVar11);
        tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&buildInfo);
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_3d0);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&rangeTimes);
        std::__cxx11::string::~string((string *)&local_448);
        std::__cxx11::string::~string((string *)&local_378);
        std::__cxx11::string::~string((string *)&shaders_1);
        iVar14 = iVar14 + -1;
      }
      tcu::TestLog::endSection(this_00);
      std::__cxx11::string::~string((string *)&plural);
      std::__cxx11::string::~string((string *)&shaders);
      iVar12 = iVar12 + 1;
    }
    pLVar1 = &buildInfo.logs;
    buildInfo._0_8_ = this_00;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pLVar1);
    std::operator<<((ostream *)pLVar1,
                    "Note: test result is the first quartile (i.e. median of the lowest half of measurements) of total times"
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&buildInfo,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pLVar1);
    fVar15 = vectorFloatFirstQuartile<long>(&totalTimes);
    this_01 = (pIVar2->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    de::floatToString_abi_cxx11_((string *)&buildInfo,(de *)0x2,fVar15 / 1000.0,precision);
    tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_PASS,(char *)buildInfo._0_8_);
    std::__cxx11::string::~string((string *)&buildInfo);
    pLVar1 = &buildInfo.logs;
    buildInfo._0_8_ = this_00;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pLVar1);
    std::operator<<((ostream *)pLVar1,
                    "Note: the following shaders are the ones from the last iteration; variables\' names and some constant expressions differ between iterations."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&buildInfo,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pLVar1);
    logProgramData(pIVar2,&latestBuildInfo,&latestProgramContext);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&totalTimes.super__Vector_base<long,_std::allocator<long>_>);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&fragmentCompileTimes.super__Vector_base<long,_std::allocator<long>_>);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&vertexCompileTimes.super__Vector_base<long,_std::allocator<long>_>);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&sourceSetTimes.super__Vector_base<long,_std::allocator<long>_>);
LAB_00f5e6d8:
    Logs::~Logs(&latestBuildInfo.logs);
    ProgramContext::~ProgramContext(&latestProgramContext);
    std::
    _Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
    ::~_Vector_base(&measurements.
                     super__Vector_base<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement,_std::allocator<deqp::gles2::Performance::InvalidShaderCompilerCase::Measurement>_>
                   );
  }
  return STOP;
}

Assistant:

InvalidShaderCompilerCase::IterateResult InvalidShaderCompilerCase::iterate (void)
{
	ShaderValidity shaderValidity = m_invalidityType == INVALIDITY_INVALID_CHAR		? SHADER_VALIDITY_INVALID_CHAR
								  : m_invalidityType == INVALIDITY_SEMANTIC_ERROR	? SHADER_VALIDITY_SEMANTIC_ERROR
								  : SHADER_VALIDITY_LAST;

	DE_ASSERT(shaderValidity != SHADER_VALIDITY_LAST);

	// Before actual measurements, compile a dummy shader to avoid possible initial slowdowns in the actual test.
	{
		deUint32		specID = getSpecializationID(0);
		ProgramContext	progCtx;
		progCtx.vertShaderSource = specializeShaderSource(singleVaryingVertexTemplate(), specID, shaderValidity);
		progCtx.fragShaderSource = specializeShaderSource(singleVaryingFragmentTemplate(), specID, shaderValidity);

		Shaders shaders = createShaders();
		setShaderSources(shaders, progCtx);

		BuildInfo buildInfo;
		buildInfo.vertCompileSuccess = compileShader(shaders.vertShader);
		buildInfo.fragCompileSuccess = compileShader(shaders.fragShader);
		if (buildInfo.vertCompileSuccess || buildInfo.fragCompileSuccess)
		{
			buildInfo.logs = getLogs(shaders);
			logProgramData(buildInfo, progCtx);
			cleanup(shaders);
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compilation of a shader erroneously succeeded");
			return STOP;
		}
		cleanup(shaders);
	}

	vector<Measurement>		measurements;
	// \note These are logged after measurements are done.
	ProgramContext			latestProgramContext;
	BuildInfo				latestBuildInfo;

	if (WARMUP_CPU_AT_BEGINNING_OF_CASE)
		tcu::warmupCPU();

	// Actual test measurements.
	while (!goodEnoughMeasurements(measurements))
	{
		// Create shader and compile. Measure time.

		// \note Shader sources are generated and GL shader objects are created before any time measurements.
		ProgramContext	progCtx		= generateShaderSources((int)measurements.size());
		Shaders			shaders		= createShaders();
		BuildInfo		buildInfo;

		if (WARMUP_CPU_BEFORE_EACH_MEASUREMENT)
			tcu::warmupCPU();

		// \note Do NOT do anything too hefty between the first and last deGetMicroseconds() here (other than the gl calls); it would disturb the measurement.

		deUint64 startTime = deGetMicroseconds();

		setShaderSources(shaders, progCtx);
		deUint64 shaderSourceSetEndTime = deGetMicroseconds();

		buildInfo.vertCompileSuccess = compileShader(shaders.vertShader);
		deUint64 vertexShaderCompileEndTime = deGetMicroseconds();

		buildInfo.fragCompileSuccess = compileShader(shaders.fragShader);
		deUint64 fragmentShaderCompileEndTime = deGetMicroseconds();

		buildInfo.logs = getLogs(shaders);

		// Both shader compilations should have failed.
		if (buildInfo.vertCompileSuccess || buildInfo.fragCompileSuccess)
		{
			logProgramData(buildInfo, progCtx);
			cleanup(shaders);
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compilation of a shader erroneously succeeded");
			return STOP;
		}

		// De-initializations (delete shaders).

		cleanup(shaders);

		// Output measurement log later (after last measurement).

		measurements.push_back(Measurement((deInt64)(shaderSourceSetEndTime			- startTime),
										   (deInt64)(vertexShaderCompileEndTime		- shaderSourceSetEndTime),
										   (deInt64)(fragmentShaderCompileEndTime	- vertexShaderCompileEndTime)));

		latestBuildInfo			= buildInfo;
		latestProgramContext	= progCtx;

		m_testCtx.touchWatchdog(); // \note Measurements may take a while in a bad case.
	}

	// End of test case, log information about measurements.
	{
		TestLog& log = m_testCtx.getLog();

		vector<deInt64> sourceSetTimes;
		vector<deInt64> vertexCompileTimes;
		vector<deInt64> fragmentCompileTimes;
		vector<deInt64> totalTimes;

		log << TestLog::Section("IterationMeasurements", "Iteration measurements of compilation times");

		for (int ndx = 0; ndx < (int)measurements.size(); ndx++)
		{
			sourceSetTimes.push_back		(measurements[ndx].sourceSetTime);
			vertexCompileTimes.push_back	(measurements[ndx].vertexCompileTime);
			fragmentCompileTimes.push_back	(measurements[ndx].fragmentCompileTime);
			totalTimes.push_back			(measurements[ndx].totalTime());

			// Log this measurement.
			log << TestLog::Float("Measurement" + de::toString(ndx) + "Time",
								  "Measurement " + de::toString(ndx) + " time",
								  "ms", QP_KEY_TAG_TIME, (float)measurements[ndx].totalTime()/1000.0f);
		}

		// Log some statistics.

		for (int entireRangeOrLowestHalf = 0; entireRangeOrLowestHalf < 2; entireRangeOrLowestHalf++)
		{
			bool				isEntireRange	= entireRangeOrLowestHalf == 0;
			string				statNamePrefix	= isEntireRange ? "" : "LowestHalf";
			vector<deInt64>		rangeTimes		= isEntireRange ? totalTimes : vectorLowestPercentage(totalTimes, 0.5f);

			log << TestLog::Message << "\nStatistics computed from "
									<< (isEntireRange ? "all" : "only the lowest 50%")
									<< " of the above measurements:"
									<< TestLog::EndMessage;

#define LOG_TIME_STAT(NAME, DESC, FUNC)			log << TestLog::Float(statNamePrefix + "TotalTime" + (NAME), (DESC) + string(" of total time"), "ms",	QP_KEY_TAG_TIME, (FUNC)(rangeTimes)/1000.0f)
#define LOG_RELATIVE_STAT(NAME, DESC, FUNC)		log << TestLog::Float(statNamePrefix + "TotalTime" + (NAME), (DESC) + string(" of total time"), "",		QP_KEY_TAG_NONE, (FUNC)(rangeTimes))

			LOG_TIME_STAT		("Median",							"Median",								vectorFloatMedian);
			LOG_TIME_STAT		("Average",							"Average",								vectorFloatAverage);
			LOG_TIME_STAT		("Minimum",							"Minimum",								vectorFloatMinimum);
			LOG_TIME_STAT		("Maximum",							"Maximum",								vectorFloatMaximum);
			LOG_TIME_STAT		("MedianAbsoluteDeviation",			"Median absolute deviation",			vectorFloatMedianAbsoluteDeviation);
			LOG_RELATIVE_STAT	("RelativeMedianAbsoluteDeviation",	"Relative median absolute deviation",	vectorFloatRelativeMedianAbsoluteDeviation);
			LOG_TIME_STAT		("StandardDeviation",				"Standard deviation",					vectorFloatStandardDeviation);
			LOG_RELATIVE_STAT	("RelativeStandardDeviation",		"Relative standard deviation",			vectorFloatRelativeStandardDeviation);
			LOG_TIME_STAT		("MaxMinusMin",						"Max-min",								vectorFloatMaximumMinusMinimum);
			LOG_RELATIVE_STAT	("RelativeMaxMinusMin",				"Relative max-min",						vectorFloatRelativeMaximumMinusMinimum);

#undef LOG_TIME_STAT
#undef LOG_RELATIVE_STAT

			if (!isEntireRange && vectorFloatRelativeMedianAbsoluteDeviation(rangeTimes) > RELATIVE_MEDIAN_ABSOLUTE_DEVIATION_THRESHOLD)
				log << TestLog::Message << "\nWARNING: couldn't achieve relative median absolute deviation under threshold value " << RELATIVE_MEDIAN_ABSOLUTE_DEVIATION_THRESHOLD << TestLog::EndMessage;
		}

		log << TestLog::EndSection; // End section IterationMeasurements

		for (int medianOrAverage = 0; medianOrAverage < 2; medianOrAverage++)
		{
			typedef float (*VecFunc)(const vector<deInt64>&);

			bool	isMedian						= medianOrAverage == 0;
			string	singular						= isMedian ? "Median" : "Average";
			string	plural							= singular + "s";
			VecFunc func							= isMedian ? (VecFunc) vectorFloatMedian<deInt64> : (VecFunc) vectorFloatAverage<deInt64>;

			log << TestLog::Section(plural + "PerPhase", plural + " per phase");

			for (int entireRangeOrLowestHalf = 0; entireRangeOrLowestHalf < 2; entireRangeOrLowestHalf++)
			{
				bool	isEntireRange	= entireRangeOrLowestHalf == 0;
				string	statNamePrefix	= isEntireRange ? "" : "LowestHalf";
				float	rangeSizeRatio	= isEntireRange ? 1.0f : 0.5f;

#define LOG_TIME(NAME, DESC, DATA) log << TestLog::Float(statNamePrefix + (NAME) + singular, singular + " of " + (DESC), "ms", QP_KEY_TAG_TIME, func(vectorLowestPercentage((DATA), rangeSizeRatio))/1000.0f);

				log << TestLog::Message << (isEntireRange ? "For all measurements:" : "\nFor only the lowest 50% of the measurements:") << TestLog::EndMessage;
				LOG_TIME("ShaderSourceSetTime",			"shader source set time",			sourceSetTimes);
				LOG_TIME("VertexShaderCompileTime",		"vertex shader compile time",		vertexCompileTimes);
				LOG_TIME("FragmentShaderCompileTime",	"fragment shader compile time",		fragmentCompileTimes);

#undef LOG_TIME
			}

			log << TestLog::EndSection;
		}

		// Set result.

		{
			log << TestLog::Message << "Note: test result is the first quartile (i.e. median of the lowest half of measurements) of total times" << TestLog::EndMessage;
			float result = vectorFloatFirstQuartile(totalTimes) / 1000.0f;
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(result, 2).c_str());
		}

		// Log shaders.

		log << TestLog::Message << "Note: the following shaders are the ones from the last iteration; variables' names and some constant expressions differ between iterations." << TestLog::EndMessage;

		logProgramData(latestBuildInfo, latestProgramContext);

		return STOP;
	}
}